

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O3

int __thiscall OpenMD::StringTokenizer::nextTokenAsInt(StringTokenizer *this)

{
  int iVar1;
  string token;
  string local_30;
  
  nextToken_abi_cxx11_(&local_30,this);
  iVar1 = atoi(local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int StringTokenizer::nextTokenAsInt() {
    std::string token = nextToken();

    return atoi(token.c_str());
  }